

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O3

FString __thiscall input_mod::GetStats(input_mod *this)

{
  IT_PLAYING **ppIVar1;
  int iVar2;
  byte *pbVar3;
  undefined1 auVar4 [16];
  DUMB_IT_SIGRENDERER *pDVar5;
  DUMB_IT_SIGDATA *pDVar6;
  int iVar7;
  long lVar8;
  long in_RSI;
  ulong uVar9;
  int iVar10;
  undefined1 auVar11 [16];
  
  pDVar5 = duh_get_it_sigrenderer(*(DUH_SIGRENDERER **)(in_RSI + 0x78));
  pDVar6 = duh_get_it_sigdata(*(DUH **)(in_RSI + 0x70));
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)0x723dac;
  iVar7 = 0;
  lVar8 = 0xa8;
  do {
    pbVar3 = *(byte **)(pDVar5->channel[0].arpeggio_offsets + lVar8 + -0x50);
    if (pbVar3 != (byte *)0x0) {
      iVar7 = iVar7 + (uint)((*pbVar3 & 8) == 0);
    }
    lVar8 = lVar8 + 0xa0;
  } while (lVar8 != 0x28a8);
  iVar10 = 0;
  lVar8 = 0;
  do {
    ppIVar1 = pDVar5->playing + lVar8;
    auVar11._0_4_ = -(uint)(*(int *)ppIVar1 == 0);
    auVar11._8_4_ = -(uint)(*(int *)(ppIVar1 + 1) == 0);
    auVar11._12_4_ = -(uint)(*(int *)((long)ppIVar1 + 0xc) == 0);
    auVar11._4_4_ = auVar11._8_4_;
    auVar4._4_4_ = auVar11._12_4_;
    auVar4._0_4_ = -(uint)(*(int *)((long)ppIVar1 + 4) == 0);
    auVar4._8_4_ = auVar11._12_4_;
    auVar4._12_4_ = auVar11._8_4_;
    iVar7 = iVar7 + SUB164(auVar11 & auVar4,0) + 1;
    iVar10 = iVar10 + SUB164(auVar11 & auVar4,4) + 1;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 0xc0);
  if (pDVar6 == (DUMB_IT_SIGDATA *)0x0) {
    FString::operator=((FString *)this,"Problem getting stats");
  }
  else {
    iVar2 = pDVar5->order;
    uVar9 = 0;
    if ((pDVar6->order != (uchar *)0x0) && (iVar2 < pDVar6->n_orders)) {
      uVar9 = (ulong)pDVar6->order[iVar2];
    }
    FString::Format((FString *)this,
                    "%s, Order:%3d/%d Patt:%2d/%d Row:%2d/%2d Chan:%2d/%2d Speed:%2d Tempo:%3d",
                    *(undefined8 *)(in_RSI + 0x18),(long)iVar2,(ulong)*(uint *)(in_RSI + 0x38),uVar9
                    ,(ulong)*(uint *)(in_RSI + 0x34),(ulong)(uint)pDVar5->row,
                    (ulong)(uint)pDVar5->n_rows,iVar10 + iVar7,(ulong)*(uint *)(in_RSI + 0x30),
                    (ulong)(uint)pDVar5->speed,(ulong)(uint)pDVar5->tempo);
  }
  return (FString)(char *)this;
}

Assistant:

FString input_mod::GetStats()
{
	//return StreamSong::GetStats();
	DUMB_IT_SIGRENDERER *itsr = duh_get_it_sigrenderer(sr);
	DUMB_IT_SIGDATA *itsd = duh_get_it_sigdata(duh);
	FString out;

	int channels = 0;
	for (int i = 0; i < DUMB_IT_N_CHANNELS; i++)
	{
		IT_PLAYING * playing = itsr->channel[i].playing;
		if (playing && !(playing->flags & IT_PLAYING_DEAD)) channels++;
	}
	for (int i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++)
	{
		if (itsr->playing[i]) channels++;
	}

	if (itsr == NULL || itsd == NULL)
	{
		out = "Problem getting stats";
	}
	else
	{
		out.Format("%s, Order:%3d/%d Patt:%2d/%d Row:%2d/%2d Chan:%2d/%2d Speed:%2d Tempo:%3d",
			Codec.GetChars(),
			itsr->order, NumOrders,
			(itsd->order && itsr->order < itsd->n_orders ? itsd->order[itsr->order] : 0), NumPatterns,
			itsr->row, itsr->n_rows,
			channels, NumChannels,
			itsr->speed,
			itsr->tempo
			);
	}
	return out;
}